

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_validate(App *this)

{
  ulong uVar1;
  bool bVar2;
  App *this_00;
  undefined8 uVar3;
  element_type *this_01;
  size_type sVar4;
  long in_RDI;
  App_p *app;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  size_t nameless_subs;
  difference_type pcount_req;
  difference_type pcount;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
  *in_stack_fffffffffffffed8;
  __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  *in_stack_fffffffffffffee0;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffff17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  ExitCodes in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  InvalidError *in_stack_ffffffffffffff60;
  __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
  local_90;
  long local_88;
  long local_80;
  undefined1 local_75;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_40;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_38;
  difference_type local_30;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_20;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_18;
  
  local_18 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                         *)in_stack_fffffffffffffed8);
  local_20 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
             ::std::
             end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                       ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                         *)in_stack_fffffffffffffed8);
  this_00 = (App *)::std::
                   count_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_validate()const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                             (local_18,local_20);
  if (1 < (long)this_00) {
    local_38 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
               ::std::
               begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                         ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                           *)in_stack_fffffffffffffed8);
    local_40 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
               ::std::
               end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                         ((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                           *)in_stack_fffffffffffffed8);
    local_30 = ::std::
               count_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_validate()const::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                         (local_38,local_40);
    if (1 < (long)this_00 - local_30) {
      local_75 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      InvalidError::InvalidError
                ((InvalidError *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      local_75 = 0;
      __cxa_throw(uVar3,&InvalidError::typeinfo,InvalidError::~InvalidError);
    }
  }
  local_80 = 0;
  local_88 = in_RDI + 0x2c0;
  local_90._M_current =
       (shared_ptr<CLI::App> *)
       std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::begin
                 (in_stack_fffffffffffffed8);
  std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
            (in_stack_fffffffffffffed8);
  while (bVar2 = __gnu_cxx::
                 operator==<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                           (in_stack_fffffffffffffee0,
                            (__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)in_stack_fffffffffffffed8), ((bVar2 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffff60 =
         (InvalidError *)
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
         ::operator*(&local_90);
    std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1aab92);
    _validate(this_00);
    this_01 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         0x1aaba7);
    get_name_abi_cxx11_(this_01);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1aabb7
                      );
    if (bVar2) {
      local_80 = local_80 + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&local_90);
  }
  if (*(long *)(in_RDI + 0x2f8) != 0) {
    if ((*(long *)(in_RDI + 0x300) != 0) &&
       (*(ulong *)(in_RDI + 0x300) < *(ulong *)(in_RDI + 0x2f8))) {
      uVar3 = __cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffff17,
                          CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
      InvalidError::InvalidError
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
      __cxa_throw(uVar3,&InvalidError::typeinfo,InvalidError::~InvalidError);
    }
    uVar1 = *(ulong *)(in_RDI + 0x2f8);
    sVar4 = std::
            vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
            ::size((vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                    *)(in_RDI + 0xd8));
    if (sVar4 + local_80 < uVar1) {
      uVar5 = 1;
      uVar3 = __cxa_allocate_exception(0x38);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff20,(char *)in_stack_ffffffffffffff18,
                 (allocator<char> *)
                 CONCAT17(in_stack_ffffffffffffff17,CONCAT16(uVar5,in_stack_ffffffffffffff10)));
      InvalidError::InvalidError
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
      __cxa_throw(uVar3,&InvalidError::typeinfo,InvalidError::~InvalidError);
    }
  }
  return;
}

Assistant:

CLI11_INLINE void App::_validate() const {
    // count the number of positional only args
    auto pcount = std::count_if(std::begin(options_), std::end(options_), [](const Option_p &opt) {
        return opt->get_items_expected_max() >= detail::expected_max_vector_size && !opt->nonpositional();
    });
    if(pcount > 1) {
        auto pcount_req = std::count_if(std::begin(options_), std::end(options_), [](const Option_p &opt) {
            return opt->get_items_expected_max() >= detail::expected_max_vector_size && !opt->nonpositional() &&
                   opt->get_required();
        });
        if(pcount - pcount_req > 1) {
            throw InvalidError(name_);
        }
    }

    std::size_t nameless_subs{0};
    for(const App_p &app : subcommands_) {
        app->_validate();
        if(app->get_name().empty())
            ++nameless_subs;
    }

    if(require_option_min_ > 0) {
        if(require_option_max_ > 0) {
            if(require_option_max_ < require_option_min_) {
                throw(InvalidError("Required min options greater than required max options", ExitCodes::InvalidError));
            }
        }
        if(require_option_min_ > (options_.size() + nameless_subs)) {
            throw(
                InvalidError("Required min options greater than number of available options", ExitCodes::InvalidError));
        }
    }
}